

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void chan_calc(OPL3 *chip,OPL3_CH *CH)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  
  if (CH->Muted != '\0') {
    return;
  }
  chip->phase_modulation = 0;
  chip->phase_modulation2 = 0;
  iVar7 = CH->SLOT[0].volume;
  iVar2 = CH->SLOT[0].TLL;
  uVar8 = CH->SLOT[0].AMmask;
  uVar3 = chip->LFO_AM;
  iVar4 = CH->SLOT[0].op1_out[0];
  iVar5 = CH->SLOT[0].op1_out[1];
  CH->SLOT[0].op1_out[0] = iVar5;
  CH->SLOT[0].op1_out[1] = 0;
  uVar8 = (uVar8 & uVar3) + iVar7 + iVar2;
  iVar7 = 0;
  if (uVar8 < 0x1a0) {
    bVar1 = CH->SLOT[0].FB;
    iVar7 = 0;
    if (bVar1 != 0) {
      iVar7 = iVar5 + iVar4;
    }
    iVar7 = op_calc1(CH->SLOT[0].Cnt,uVar8,iVar7 << (bVar1 & 0x1f),CH->SLOT[0].wavetable);
    CH->SLOT[0].op1_out[1] = iVar7;
  }
  piVar6 = CH->SLOT[0].connect;
  *piVar6 = *piVar6 + iVar7;
  uVar8 = (CH->SLOT[1].AMmask & chip->LFO_AM) + CH->SLOT[1].volume + CH->SLOT[1].TLL;
  if (uVar8 < 0x1a0) {
    iVar7 = op_calc(CH->SLOT[1].Cnt,uVar8,chip->phase_modulation,CH->SLOT[1].wavetable);
    piVar6 = CH->SLOT[1].connect;
    *piVar6 = *piVar6 + iVar7;
  }
  return;
}

Assistant:

INLINE void chan_calc(FM_OPN *OPN, FM_CH *CH, int chnum)
{
	INT32 out = 0;
	UINT32 AM = OPN->LFO_AM >> CH->ams;
	unsigned int eg_out;

	if (CH->Muted)
		return;

	OPN->m2 = OPN->c1 = OPN->c2 = OPN->mem = 0;

	*CH->mem_connect = CH->mem_value;  /* restore delayed sample (MEM) value to m2 or c2 */

	eg_out = volume_calc(&CH->SLOT[SLOT1]);
	if( eg_out < ENV_QUIET )  /* SLOT 1 */
	{
		if (CH->FB < SIN_BITS)
			out = (CH->op1_out[0] + CH->op1_out[1]) << (FREQ_SH - CH->FB);

		out = op_calc1(CH->SLOT[SLOT1].phase, eg_out, out);
	}

	CH->op1_out[0] = CH->op1_out[1];
	CH->op1_out[1] = out;

	if( !CH->connect1 ){
		/* algorithm 5  */
		OPN->mem = OPN->c1 = OPN->c2 = out;
	}else{
		/* other algorithms */
		*CH->connect1 = out;
	}

	eg_out = volume_calc(&CH->SLOT[SLOT3]);
	if( eg_out < ENV_QUIET )    /* SLOT 3 */
		*CH->connect3 += op_calc(CH->SLOT[SLOT3].phase, eg_out, OPN->m2);

	eg_out = volume_calc(&CH->SLOT[SLOT2]);
	if( eg_out < ENV_QUIET )    /* SLOT 2 */
		*CH->connect2 += op_calc(CH->SLOT[SLOT2].phase, eg_out, OPN->c1);

	eg_out = volume_calc(&CH->SLOT[SLOT4]);
	if( eg_out < ENV_QUIET )    /* SLOT 4 */
		*CH->connect4 += op_calc(CH->SLOT[SLOT4].phase, eg_out, OPN->c2);

	/* store current MEM */
	CH->mem_value = OPN->mem;

	/* update phase counters AFTER output calculations */
	if (CH->pms)
	{
		/* 3-slot mode */
		if ((OPN->ST.mode & 0xC0) && (CH == &OPN->P_CH[2]))
		{
			/* keyscale code is not modified by LFO */
			UINT8 kc = CH->kcode;
			UINT32 pm = CH->pms + OPN->LFO_PM;
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT1], pm, kc, OPN->SL3.block_fnum[1]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT2], pm, kc, OPN->SL3.block_fnum[2]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT3], pm, kc, OPN->SL3.block_fnum[0]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT4], pm, kc, CH->block_fnum);
		}
		else
		{
			update_phase_lfo_channel(OPN, CH);
		}
	}
	else  /* no LFO phase modulation */
	{
		CH->SLOT[SLOT1].phase += CH->SLOT[SLOT1].Incr;
		CH->SLOT[SLOT2].phase += CH->SLOT[SLOT2].Incr;
		CH->SLOT[SLOT3].phase += CH->SLOT[SLOT3].Incr;
		CH->SLOT[SLOT4].phase += CH->SLOT[SLOT4].Incr;
	}
}